

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataBuffer.cpp
# Opt level: O2

void __thiscall Jupiter::DataBuffer::secure(DataBuffer *this,size_t size_)

{
  uint8_t *puVar1;
  ulong __size;
  uint8_t *__dest;
  size_t __n;
  
  puVar1 = this->head;
  __n = (long)this->end - (long)puVar1;
  __size = size_ + __n;
  if (this->bufferSize < __size) {
    __dest = this->base;
    if (__dest != puVar1) {
      memmove(__dest,puVar1,__n);
      __dest = this->base;
    }
    puVar1 = (uint8_t *)realloc(__dest,__size);
    this->base = puVar1;
    this->head = puVar1;
    this->end = puVar1 + __n;
    this->bufferSize = __size;
  }
  return;
}

Assistant:

void Jupiter::DataBuffer::secure(size_t size_) {
	size_t data_size = Jupiter::DataBuffer::end - Jupiter::DataBuffer::head;
	size_ += data_size;
	if (Jupiter::DataBuffer::bufferSize < size_)
	{
		if (Jupiter::DataBuffer::base != Jupiter::DataBuffer::head)
			memmove(Jupiter::DataBuffer::base, Jupiter::DataBuffer::head, data_size);

		Jupiter::DataBuffer::base = reinterpret_cast<uint8_t *>(realloc(Jupiter::DataBuffer::base, size_));
		Jupiter::DataBuffer::head = Jupiter::DataBuffer::base;
		Jupiter::DataBuffer::end = Jupiter::DataBuffer::head + data_size;
		Jupiter::DataBuffer::bufferSize = size_;
	}
}